

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O2

uint64_t aom_highbd_sse_odd_size(uint8_t *a,int a_stride,uint8_t *b,int b_stride,int w,int h)

{
  int64_t sum;
  uint64_t sse;
  
  highbd_variance64(a,a_stride,b,b_stride,w,h,&sse,&sum);
  return sse;
}

Assistant:

uint64_t aom_highbd_sse_odd_size(const uint8_t *a, int a_stride,
                                 const uint8_t *b, int b_stride, int w, int h) {
  uint64_t sse;
  int64_t sum;
  highbd_variance64(a, a_stride, b, b_stride, w, h, &sse, &sum);
  return sse;
}